

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_spacing(nk_context *ctx,int cols)

{
  nk_window *win;
  nk_panel *pnVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  nk_rect none;
  nk_rect nStack_38;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4f98,"void nk_spacing(struct nk_context *, int)");
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4f99,"void nk_spacing(struct nk_context *, int)");
  }
  pnVar1 = win->layout;
  if (pnVar1 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4f9a,"void nk_spacing(struct nk_context *, int)");
  }
  iVar3 = (pnVar1->row).index + cols;
  iVar4 = (pnVar1->row).columns;
  uVar2 = (long)iVar3 / (long)iVar4;
  iVar3 = iVar3 % iVar4;
  iVar4 = (int)uVar2;
  if (iVar4 != 0) {
    uVar5 = 0;
    if (0 < iVar4) {
      uVar5 = uVar2 & 0xffffffff;
    }
    while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), cols = iVar3, iVar4 != 0) {
      nk_panel_alloc_row(ctx,win);
    }
  }
  if (((pnVar1->row).type & ~NK_LAYOUT_STATIC_FIXED) != NK_LAYOUT_DYNAMIC_FIXED) {
    iVar4 = 0;
    if (0 < cols) {
      iVar4 = cols;
    }
    while (iVar4 != 0) {
      nk_panel_alloc_space(&nStack_38,ctx);
      iVar4 = iVar4 + -1;
    }
  }
  (pnVar1->row).index = iVar3;
  return;
}

Assistant:

NK_API void
nk_spacing(struct nk_context *ctx, int cols)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_rect none;
    int i, index, rows;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    /* spacing over row boundaries */
    win = ctx->current;
    layout = win->layout;
    index = (layout->row.index + cols) % layout->row.columns;
    rows = (layout->row.index + cols) / layout->row.columns;
    if (rows) {
        for (i = 0; i < rows; ++i)
            nk_panel_alloc_row(ctx, win);
        cols = index;
    }
    /* non table layout need to allocate space */
    if (layout->row.type != NK_LAYOUT_DYNAMIC_FIXED &&
        layout->row.type != NK_LAYOUT_STATIC_FIXED) {
        for (i = 0; i < cols; ++i)
            nk_panel_alloc_space(&none, ctx);
    }
    layout->row.index = index;
}